

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

void munge_xlstring(char *dest,char *src,int n)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  
  iVar2 = 1;
  if (1 < n) {
    iVar2 = n;
  }
  for (uVar4 = 0; uVar3 = (ulong)(iVar2 - 1), iVar2 - 1 != uVar4; uVar4 = uVar4 + 1) {
    cVar1 = src[uVar4];
    cVar5 = '_';
    if (((cVar1 != '\n') && (cVar1 != ':')) && (uVar3 = uVar4, cVar5 = cVar1, cVar1 == '\0')) break;
    dest[uVar4] = cVar5;
  }
  dest[uVar3] = '\0';
  return;
}

Assistant:

void munge_xlstring(char *dest, const char *src, int n)
{
    int i;

    for (i = 0; i < n - 1 && src[i]; i++) {
	if (src[i] == SEPC || src[i] == '\n') {
	    dest[i] = '_';
	} else {
	    dest[i] = src[i];
	}
    }

    dest[i] = '\0';
}